

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_assign_statement(Parser *this)

{
  Type TVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  bool bVar4;
  Type local_354;
  Token local_350;
  Type local_2f4;
  Token local_2f0;
  Type local_294;
  Token local_290;
  int local_238 [6];
  Token local_220;
  int local_1c4 [8];
  int local_1a4;
  stringstream local_1a0 [8];
  stringstream buffer;
  int local_18 [2];
  Parser *local_10;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_18[1] = 0x32;
  local_18[0] = 1;
  local_10 = this;
  pTVar2 = forward_token(this,local_18);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_18 + 1),pTVar2);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 1;
  pTVar2 = forward_token(this,&local_1a4);
  TVar1 = Token::type(pTVar2);
  bVar4 = false;
  if (TVar1 == kIdentity) {
    local_1c4[3] = 2;
    pTVar2 = forward_token(this,local_1c4 + 3);
    TVar1 = Token::type(pTVar2);
    bVar4 = TVar1 == kLeftBracket;
  }
  if (bVar4) {
    pAVar3 = this->current_;
    local_1c4[2] = 0x36;
    local_1c4[1] = 1;
    pTVar2 = forward_token(this,local_1c4 + 1);
    pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_1c4 + 2),pTVar2);
    this->current_ = pAVar3;
    pAVar3 = this->current_;
    local_1c4[0] = 1;
    pTVar2 = forward_token(this,local_1c4);
    AbstractSyntaxNode::add_child(pAVar3,pTVar2);
    local_238[5] = 0x21;
    match(&local_220,this,(Type *)(local_238 + 5));
    Token::~Token(&local_220);
    local_238[4] = 1;
    pTVar2 = forward_token(this,local_238 + 4);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kLeftBracket) {
      parse_array(this);
    }
    pAVar3 = AbstractSyntaxNode::parent(this->current_);
    this->current_ = pAVar3;
  }
  else {
    local_238[3] = 1;
    pTVar2 = forward_token(this,local_238 + 3);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kIdentity) {
      pAVar3 = this->current_;
      local_238[2] = 0x21;
      local_238[1] = 1;
      pTVar2 = forward_token(this,local_238 + 1);
      pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_238 + 2),pTVar2);
      this->current_ = pAVar3;
      pAVar3 = this->current_;
      local_238[0] = 1;
      pTVar2 = forward_token(this,local_238);
      AbstractSyntaxNode::add_child(pAVar3,pTVar2);
      local_294 = kIdentity;
      match(&local_290,this,&local_294);
      Token::~Token(&local_290);
      pAVar3 = AbstractSyntaxNode::parent(this->current_);
      this->current_ = pAVar3;
    }
  }
  local_2f4 = kAssign;
  match(&local_2f0,this,&local_2f4);
  Token::~Token(&local_2f0);
  parse_expression(this);
  local_354 = kSemicolon;
  match(&local_350,this,&local_354);
  Token::~Token(&local_350);
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Parser::parse_assign_statement() {
    current_ = current_->add_child(Token::Type::kAssignStatement, forward_token());
    std::stringstream buffer;

    if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftBracket) {
        current_ = current_->add_child(Token::Type::kIdentityArray, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
        current_ = current_->parent();
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_ = current_->add_child(Token::Type::kIdentity, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        current_ = current_->parent();
    }

    match(Token::Type::kAssign);
    parse_expression();
    match(Token::Type::kSemicolon);

    current_ = current_->parent();
}